

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O1

void TestDoubleToShortestSingle(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  StringBuilder builder;
  char buffer [128];
  StringBuilder local_1c0;
  DoubleToStringConverter local_1a8;
  DoubleToStringConverter local_178;
  DoubleToStringConverter local_148;
  DoubleToStringConverter local_118;
  DoubleToStringConverter local_e8;
  DoubleToStringConverter local_b8;
  char local_88 [128];
  
  local_1c0.buffer_.start_ = local_88;
  local_1c0.buffer_.length_ = 0x80;
  local_1c0.position_ = 0;
  local_1a8.flags_ = 9;
  local_1a8.infinity_symbol_ = (char *)0x0;
  local_1a8.nan_symbol_ = (char *)0x0;
  local_1a8.exponent_character_ = 'e';
  local_1a8.decimal_in_shortest_low_ = -6;
  local_1a8.decimal_in_shortest_high_ = 0x15;
  local_1a8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1a8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1a8.min_exponent_width_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                    (&local_1a8,0.0,&local_1c0,SHORTEST_SINGLE);
  pcVar3 = local_1c0.buffer_.start_;
  if (bVar1) {
    local_1c0.buffer_.start_[local_1c0.position_] = '\0';
    local_1c0.position_ = -1;
    if (local_1c0.buffer_.start_ == (char *)0x0) {
LAB_0082d96e:
      local_1c0.position_ = -1;
      abort();
    }
    iVar2 = strcmp("0",local_1c0.buffer_.start_);
    if (iVar2 != 0) {
      pcVar4 = "\"0\"";
      pcVar6 = "0";
      uVar5 = 0x125;
LAB_0082e34b:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-conversions.cc"
             ,uVar5,pcVar4,"builder.Finalize()",pcVar6,pcVar3);
      abort();
    }
    local_1c0.position_ = 0;
    bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                      (&local_1a8,12345.0,&local_1c0,SHORTEST_SINGLE);
    pcVar3 = local_1c0.buffer_.start_;
    if (bVar1) {
      local_1c0.buffer_.start_[local_1c0.position_] = '\0';
      local_1c0.position_ = -1;
      if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
      iVar2 = strcmp("12345",local_1c0.buffer_.start_);
      if (iVar2 != 0) {
        pcVar4 = "\"12345\"";
        pcVar6 = "12345";
        uVar5 = 0x129;
        goto LAB_0082e34b;
      }
      local_1c0.position_ = 0;
      bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                        (&local_1a8,1.2345000166635386e+27,&local_1c0,SHORTEST_SINGLE);
      pcVar3 = local_1c0.buffer_.start_;
      if (bVar1) {
        local_1c0.buffer_.start_[local_1c0.position_] = '\0';
        local_1c0.position_ = -1;
        if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
        iVar2 = strcmp("1.2345e+27",local_1c0.buffer_.start_);
        if (iVar2 != 0) {
          pcVar4 = "\"1.2345e+27\"";
          pcVar6 = "1.2345e+27";
          uVar5 = 0x12d;
          goto LAB_0082e34b;
        }
        local_1c0.position_ = 0;
        bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                          (&local_1a8,1.0000000200408773e+21,&local_1c0,SHORTEST_SINGLE);
        pcVar3 = local_1c0.buffer_.start_;
        if (bVar1) {
          local_1c0.buffer_.start_[local_1c0.position_] = '\0';
          local_1c0.position_ = -1;
          if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
          iVar2 = strcmp("1e+21",local_1c0.buffer_.start_);
          if (iVar2 != 0) {
            pcVar4 = "\"1e+21\"";
            pcVar6 = "1e+21";
            uVar5 = 0x131;
            goto LAB_0082e34b;
          }
          local_1c0.position_ = 0;
          bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                            (&local_1a8,1.0000000200408773e+20,&local_1c0,SHORTEST_SINGLE);
          pcVar3 = local_1c0.buffer_.start_;
          if (bVar1) {
            local_1c0.buffer_.start_[local_1c0.position_] = '\0';
            local_1c0.position_ = -1;
            if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
            iVar2 = strcmp("100000000000000000000",local_1c0.buffer_.start_);
            if (iVar2 != 0) {
              pcVar4 = "\"100000000000000000000\"";
              pcVar6 = "100000000000000000000";
              uVar5 = 0x135;
              goto LAB_0082e34b;
            }
            local_1c0.position_ = 0;
            bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                              (&local_1a8,1.1111111236053159e+20,&local_1c0,SHORTEST_SINGLE);
            pcVar3 = local_1c0.buffer_.start_;
            if (bVar1) {
              local_1c0.buffer_.start_[local_1c0.position_] = '\0';
              local_1c0.position_ = -1;
              if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
              iVar2 = strcmp("111111110000000000000",local_1c0.buffer_.start_);
              if (iVar2 != 0) {
                pcVar4 = "\"111111110000000000000\"";
                pcVar6 = "111111110000000000000";
                uVar5 = 0x139;
                goto LAB_0082e34b;
              }
              local_1c0.position_ = 0;
              bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                (&local_1a8,1.111111141197502e+21,&local_1c0,SHORTEST_SINGLE);
              pcVar3 = local_1c0.buffer_.start_;
              if (bVar1) {
                local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                local_1c0.position_ = -1;
                if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                iVar2 = strcmp("1.11111114e+21",local_1c0.buffer_.start_);
                if (iVar2 != 0) {
                  pcVar4 = "\"1.11111114e+21\"";
                  pcVar6 = "1.11111114e+21";
                  uVar5 = 0x13d;
                  goto LAB_0082e34b;
                }
                local_1c0.position_ = 0;
                bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                  (&local_1a8,1.1111110989762554e+22,&local_1c0,SHORTEST_SINGLE);
                pcVar3 = local_1c0.buffer_.start_;
                if (bVar1) {
                  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                  local_1c0.position_ = -1;
                  if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                  iVar2 = strcmp("1.1111111e+22",local_1c0.buffer_.start_);
                  if (iVar2 != 0) {
                    pcVar4 = "\"1.1111111e+22\"";
                    pcVar6 = "1.1111111e+22";
                    uVar5 = 0x141;
                    goto LAB_0082e34b;
                  }
                  local_1c0.position_ = 0;
                  bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                    (&local_1a8,-9.999999747378752e-06,&local_1c0,SHORTEST_SINGLE);
                  pcVar3 = local_1c0.buffer_.start_;
                  if (bVar1) {
                    local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                    local_1c0.position_ = -1;
                    if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                    iVar2 = strcmp("-0.00001",local_1c0.buffer_.start_);
                    if (iVar2 != 0) {
                      pcVar4 = "\"-0.00001\"";
                      pcVar6 = "-0.00001";
                      uVar5 = 0x145;
                      goto LAB_0082e34b;
                    }
                    local_1c0.position_ = 0;
                    bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                      (&local_1a8,-9.999999974752427e-07,&local_1c0,SHORTEST_SINGLE)
                    ;
                    pcVar3 = local_1c0.buffer_.start_;
                    if (bVar1) {
                      local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                      local_1c0.position_ = -1;
                      if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                      iVar2 = strcmp("-0.000001",local_1c0.buffer_.start_);
                      if (iVar2 != 0) {
                        pcVar4 = "\"-0.000001\"";
                        pcVar6 = "-0.000001";
                        uVar5 = 0x149;
                        goto LAB_0082e34b;
                      }
                      local_1c0.position_ = 0;
                      bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                        (&local_1a8,-1.0000000116860974e-07,&local_1c0,
                                         SHORTEST_SINGLE);
                      pcVar3 = local_1c0.buffer_.start_;
                      if (bVar1) {
                        local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                        local_1c0.position_ = -1;
                        if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                        iVar2 = strcmp("-1e-7",local_1c0.buffer_.start_);
                        if (iVar2 != 0) {
                          pcVar4 = "\"-1e-7\"";
                          pcVar6 = "-1e-7";
                          uVar5 = 0x14d;
                          goto LAB_0082e34b;
                        }
                        local_1c0.position_ = 0;
                        bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                          (&local_1a8,-0.0,&local_1c0,SHORTEST_SINGLE);
                        pcVar3 = local_1c0.buffer_.start_;
                        if (bVar1) {
                          local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                          local_1c0.position_ = -1;
                          if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                          iVar2 = strcmp("0",local_1c0.buffer_.start_);
                          if (iVar2 != 0) {
                            pcVar4 = "\"0\"";
                            pcVar6 = "0";
                            uVar5 = 0x151;
                            goto LAB_0082e34b;
                          }
                          local_148.flags_ = 0;
                          local_148.infinity_symbol_ = (char *)0x0;
                          local_148.nan_symbol_ = (char *)0x0;
                          local_148.exponent_character_ = 'e';
                          local_148.decimal_in_shortest_low_ = -1;
                          local_148.decimal_in_shortest_high_ = 1;
                          local_148.max_leading_padding_zeroes_in_precision_mode_ = 0;
                          local_148.max_trailing_padding_zeroes_in_precision_mode_ = 0;
                          local_148.min_exponent_width_ = 0;
                          local_1c0.position_ = 0;
                          bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                            (&local_148,0.10000000149011612,&local_1c0,
                                             SHORTEST_SINGLE);
                          pcVar3 = local_1c0.buffer_.start_;
                          if (bVar1) {
                            local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                            local_1c0.position_ = -1;
                            if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                            iVar2 = strcmp("0.1",local_1c0.buffer_.start_);
                            if (iVar2 != 0) {
                              pcVar4 = "\"0.1\"";
                              pcVar6 = "0.1";
                              uVar5 = 0x157;
                              goto LAB_0082e34b;
                            }
                            local_1c0.position_ = 0;
                            bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                              (&local_148,0.009999999776482582,&local_1c0,
                                               SHORTEST_SINGLE);
                            pcVar3 = local_1c0.buffer_.start_;
                            if (bVar1) {
                              local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                              local_1c0.position_ = -1;
                              if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                              iVar2 = strcmp("1e-2",local_1c0.buffer_.start_);
                              if (iVar2 != 0) {
                                pcVar4 = "\"1e-2\"";
                                pcVar6 = "1e-2";
                                uVar5 = 0x15b;
                                goto LAB_0082e34b;
                              }
                              local_1c0.position_ = 0;
                              bVar1 = double_conversion::DoubleToStringConverter::
                                      ToShortestIeeeNumber
                                                (&local_148,1.0,&local_1c0,SHORTEST_SINGLE);
                              pcVar3 = local_1c0.buffer_.start_;
                              if (bVar1) {
                                local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                local_1c0.position_ = -1;
                                if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                                iVar2 = strcmp("1",local_1c0.buffer_.start_);
                                if (iVar2 != 0) {
                                  pcVar4 = "\"1\"";
                                  pcVar6 = "1";
                                  uVar5 = 0x15f;
                                  goto LAB_0082e34b;
                                }
                                local_1c0.position_ = 0;
                                bVar1 = double_conversion::DoubleToStringConverter::
                                        ToShortestIeeeNumber
                                                  (&local_148,10.0,&local_1c0,SHORTEST_SINGLE);
                                pcVar3 = local_1c0.buffer_.start_;
                                if (bVar1) {
                                  local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                  local_1c0.position_ = -1;
                                  if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                                  iVar2 = strcmp("1e1",local_1c0.buffer_.start_);
                                  if (iVar2 != 0) {
                                    pcVar4 = "\"1e1\"";
                                    pcVar6 = "1e1";
                                    uVar5 = 0x163;
                                    goto LAB_0082e34b;
                                  }
                                  local_1c0.position_ = 0;
                                  bVar1 = double_conversion::DoubleToStringConverter::
                                          ToShortestIeeeNumber
                                                    (&local_148,-0.0,&local_1c0,SHORTEST_SINGLE);
                                  pcVar3 = local_1c0.buffer_.start_;
                                  if (bVar1) {
                                    local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                    local_1c0.position_ = -1;
                                    if (local_1c0.buffer_.start_ == (char *)0x0) goto LAB_0082d96e;
                                    iVar2 = strcmp("-0",local_1c0.buffer_.start_);
                                    if (iVar2 != 0) {
                                      pcVar4 = "\"-0\"";
                                      pcVar6 = "-0";
                                      uVar5 = 0x167;
                                      goto LAB_0082e34b;
                                    }
                                    local_b8.flags_ = 6;
                                    local_b8.infinity_symbol_ = (char *)0x0;
                                    local_b8.nan_symbol_ = (char *)0x0;
                                    local_b8.exponent_character_ = 'E';
                                    local_b8.decimal_in_shortest_low_ = -5;
                                    local_b8.decimal_in_shortest_high_ = 5;
                                    local_b8.max_leading_padding_zeroes_in_precision_mode_ = 0;
                                    local_b8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
                                    local_b8.min_exponent_width_ = 0;
                                    local_1c0.position_ = 0;
                                    bVar1 = double_conversion::DoubleToStringConverter::
                                            ToShortestIeeeNumber
                                                      (&local_b8,0.10000000149011612,&local_1c0,
                                                       SHORTEST_SINGLE);
                                    pcVar3 = local_1c0.buffer_.start_;
                                    if (bVar1) {
                                      local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                      local_1c0.position_ = -1;
                                      if (local_1c0.buffer_.start_ == (char *)0x0)
                                      goto LAB_0082d96e;
                                      iVar2 = strcmp("0.1",local_1c0.buffer_.start_);
                                      if (iVar2 != 0) {
                                        pcVar4 = "\"0.1\"";
                                        pcVar6 = "0.1";
                                        uVar5 = 0x16f;
                                        goto LAB_0082e34b;
                                      }
                                      local_1c0.position_ = 0;
                                      bVar1 = double_conversion::DoubleToStringConverter::
                                              ToShortestIeeeNumber
                                                        (&local_b8,1.0,&local_1c0,SHORTEST_SINGLE);
                                      pcVar3 = local_1c0.buffer_.start_;
                                      if (bVar1) {
                                        local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                        local_1c0.position_ = -1;
                                        if (local_1c0.buffer_.start_ == (char *)0x0)
                                        goto LAB_0082d96e;
                                        iVar2 = strcmp("1.0",local_1c0.buffer_.start_);
                                        if (iVar2 != 0) {
                                          pcVar4 = "\"1.0\"";
                                          pcVar6 = "1.0";
                                          uVar5 = 0x173;
                                          goto LAB_0082e34b;
                                        }
                                        local_1c0.position_ = 0;
                                        bVar1 = double_conversion::DoubleToStringConverter::
                                                ToShortestIeeeNumber
                                                          (&local_b8,10000.0,&local_1c0,
                                                           SHORTEST_SINGLE);
                                        pcVar3 = local_1c0.buffer_.start_;
                                        if (bVar1) {
                                          local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                          local_1c0.position_ = -1;
                                          if (local_1c0.buffer_.start_ == (char *)0x0)
                                          goto LAB_0082d96e;
                                          iVar2 = strcmp("10000.0",local_1c0.buffer_.start_);
                                          if (iVar2 != 0) {
                                            pcVar4 = "\"10000.0\"";
                                            pcVar6 = "10000.0";
                                            uVar5 = 0x177;
                                            goto LAB_0082e34b;
                                          }
                                          local_1c0.position_ = 0;
                                          bVar1 = double_conversion::DoubleToStringConverter::
                                                  ToShortestIeeeNumber
                                                            (&local_b8,100000.0,&local_1c0,
                                                             SHORTEST_SINGLE);
                                          pcVar3 = local_1c0.buffer_.start_;
                                          if (bVar1) {
                                            local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                            local_1c0.position_ = -1;
                                            if (local_1c0.buffer_.start_ == (char *)0x0)
                                            goto LAB_0082d96e;
                                            iVar2 = strcmp("1E5",local_1c0.buffer_.start_);
                                            if (iVar2 != 0) {
                                              pcVar4 = "\"1E5\"";
                                              pcVar6 = "1E5";
                                              uVar5 = 0x17b;
                                              goto LAB_0082e34b;
                                            }
                                            local_178.flags_ = 1;
                                            local_178.infinity_symbol_ = (char *)0x0;
                                            local_178.nan_symbol_ = (char *)0x0;
                                            local_178.exponent_character_ = 'e';
                                            local_178.decimal_in_shortest_low_ = -6;
                                            local_178.decimal_in_shortest_high_ = 0x15;
                                            local_178.max_leading_padding_zeroes_in_precision_mode_
                                                 = 0;
                                            local_178.max_trailing_padding_zeroes_in_precision_mode_
                                                 = 0;
                                            local_178.min_exponent_width_ = 0;
                                            local_1c0.position_ = 0;
                                            bVar1 = double_conversion::DoubleToStringConverter::
                                                    ToShortestIeeeNumber
                                                              (&local_178,9.999999974752427e-07,
                                                               &local_1c0,SHORTEST_SINGLE);
                                            pcVar3 = local_1c0.buffer_.start_;
                                            if (bVar1) {
                                              local_1c0.buffer_.start_[local_1c0.position_] = '\0';
                                              local_1c0.position_ = -1;
                                              if (local_1c0.buffer_.start_ == (char *)0x0)
                                              goto LAB_0082d96e;
                                              iVar2 = strcmp("0.000001",local_1c0.buffer_.start_);
                                              if (iVar2 != 0) {
                                                pcVar4 = "\"0.000001\"";
                                                pcVar6 = "0.000001";
                                                uVar5 = 0x183;
                                                goto LAB_0082e34b;
                                              }
                                              local_1c0.position_ = 0;
                                              bVar1 = double_conversion::DoubleToStringConverter::
                                                      ToShortestIeeeNumber
                                                                (&local_178,1.0000000116860974e-07,
                                                                 &local_1c0,SHORTEST_SINGLE);
                                              pcVar3 = local_1c0.buffer_.start_;
                                              if (bVar1) {
                                                local_1c0.buffer_.start_[local_1c0.position_] = '\0'
                                                ;
                                                local_1c0.position_ = -1;
                                                if (local_1c0.buffer_.start_ == (char *)0x0)
                                                goto LAB_0082d96e;
                                                iVar2 = strcmp("1e-7",local_1c0.buffer_.start_);
                                                if (iVar2 != 0) {
                                                  pcVar4 = "\"1e-7\"";
                                                  pcVar6 = "1e-7";
                                                  uVar5 = 0x187;
                                                  goto LAB_0082e34b;
                                                }
                                                local_1c0.position_ = 0;
                                                bVar1 = double_conversion::DoubleToStringConverter::
                                                        ToShortestIeeeNumber
                                                                  (&local_178,1.1111111236053159e+20
                                                                   ,&local_1c0,SHORTEST_SINGLE);
                                                pcVar3 = local_1c0.buffer_.start_;
                                                if (bVar1) {
                                                  local_1c0.buffer_.start_[local_1c0.position_] =
                                                       '\0';
                                                  local_1c0.position_ = -1;
                                                  if (local_1c0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082d96e;
                                                  iVar2 = strcmp("111111110000000000000",
                                                                 local_1c0.buffer_.start_);
                                                  if (iVar2 != 0) {
                                                    pcVar4 = "\"111111110000000000000\"";
                                                    pcVar6 = "111111110000000000000";
                                                    uVar5 = 0x18b;
                                                    goto LAB_0082e34b;
                                                  }
                                                  local_1c0.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToShortestIeeeNumber
                                                                    (&local_178,
                                                                     1.0000000200408773e+20,
                                                                     &local_1c0,SHORTEST_SINGLE);
                                                  pcVar3 = local_1c0.buffer_.start_;
                                                  if (bVar1) {
                                                    local_1c0.buffer_.start_[local_1c0.position_] =
                                                         '\0';
                                                    local_1c0.position_ = -1;
                                                    if (local_1c0.buffer_.start_ == (char *)0x0)
                                                    goto LAB_0082d96e;
                                                    iVar2 = strcmp("100000000000000000000",
                                                                   local_1c0.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"100000000000000000000\"";
                                                      pcVar6 = "100000000000000000000";
                                                      uVar5 = 399;
                                                      goto LAB_0082e34b;
                                                    }
                                                    local_1c0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_178,
                                                                       1.111111141197502e+21,
                                                                       &local_1c0,SHORTEST_SINGLE);
                                                    pcVar3 = local_1c0.buffer_.start_;
                                                    if (bVar1) {
                                                      local_1c0.buffer_.start_[local_1c0.position_]
                                                           = '\0';
                                                      local_1c0.position_ = -1;
                                                      if (local_1c0.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0082d96e;
                                                      iVar2 = strcmp("1.11111114e+21",
                                                                     local_1c0.buffer_.start_);
                                                      if (iVar2 != 0) {
                                                        pcVar4 = "\"1.11111114e+21\"";
                                                        pcVar6 = "1.11111114e+21";
                                                        uVar5 = 0x193;
                                                        goto LAB_0082e34b;
                                                      }
                                                      local_e8.flags_ = 1;
                                                      local_e8.infinity_symbol_ = (char *)0x0;
                                                      local_e8.nan_symbol_ = (char *)0x0;
                                                      local_e8.exponent_character_ = 'e';
                                                      local_e8.decimal_in_shortest_low_ = 0;
                                                      local_e8.decimal_in_shortest_high_ = 0;
                                                      local_e8.
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_e8.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_e8.min_exponent_width_ = 0;
                                                  local_1c0.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToShortestIeeeNumber
                                                                    (&local_e8,INFINITY,&local_1c0,
                                                                     SHORTEST_SINGLE);
                                                  if (bVar1) {
                                                    pcVar3 = 
                                                  "!dc5.ToShortestSingle(Single::Infinity(), &builder)"
                                                  ;
                                                  uVar5 = 0x199;
                                                  }
                                                  else {
                                                    local_1c0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_e8,-INFINITY,
                                                                       &local_1c0,SHORTEST_SINGLE);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc5.ToShortestSingle(-Single::Infinity(), &builder)"
                                                  ;
                                                  uVar5 = 0x19c;
                                                  }
                                                  else {
                                                    local_1c0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_e8,NAN,&local_1c0,
                                                                       SHORTEST_SINGLE);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc5.ToShortestSingle(Single::NaN(), &builder)";
                                                  uVar5 = 0x19f;
                                                  }
                                                  else {
                                                    local_1c0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_e8,-NAN,&local_1c0,
                                                                       SHORTEST_SINGLE);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc5.ToShortestSingle(-Single::NaN(), &builder)";
                                                  uVar5 = 0x1a2;
                                                  }
                                                  else {
                                                    local_118.flags_ = 1;
                                                    local_118.infinity_symbol_ = "Infinity";
                                                    local_118.nan_symbol_ = "NaN";
                                                    local_118.exponent_character_ = 'e';
                                                    local_118.decimal_in_shortest_low_ = 0;
                                                    local_118.decimal_in_shortest_high_ = 0;
                                                    local_118.
                                                    max_leading_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_118.
                                                    max_trailing_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_118.min_exponent_width_ = 0;
                                                    local_1c0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_118,INFINITY,
                                                                       &local_1c0,SHORTEST_SINGLE);
                                                    pcVar3 = local_1c0.buffer_.start_;
                                                    if (bVar1) {
                                                      local_1c0.buffer_.start_[local_1c0.position_]
                                                           = '\0';
                                                      local_1c0.position_ = -1;
                                                      if (local_1c0.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0082d96e;
                                                      iVar2 = strcmp("Infinity",
                                                                     local_1c0.buffer_.start_);
                                                      if (iVar2 == 0) {
                                                        local_1c0.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::
                                                                ToShortestIeeeNumber
                                                                          (&local_118,-INFINITY,
                                                                           &local_1c0,
                                                                           SHORTEST_SINGLE);
                                                        pcVar3 = local_1c0.buffer_.start_;
                                                        if (!bVar1) {
                                                          pcVar3 = 
                                                  "dc6.ToShortestSingle(-Single::Infinity(), &builder)"
                                                  ;
                                                  uVar5 = 0x1ab;
                                                  goto LAB_0082e313;
                                                  }
                                                  local_1c0.buffer_.start_[local_1c0.position_] =
                                                       '\0';
                                                  local_1c0.position_ = -1;
                                                  if (local_1c0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082d96e;
                                                  iVar2 = strcmp("-Infinity",
                                                                 local_1c0.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_1c0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_118,NAN,&local_1c0,
                                                                       SHORTEST_SINGLE);
                                                    pcVar3 = local_1c0.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar3 = 
                                                  "dc6.ToShortestSingle(Single::NaN(), &builder)";
                                                  uVar5 = 0x1af;
                                                  goto LAB_0082e313;
                                                  }
                                                  local_1c0.buffer_.start_[local_1c0.position_] =
                                                       '\0';
                                                  local_1c0.position_ = -1;
                                                  if (local_1c0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082d96e;
                                                  iVar2 = strcmp("NaN",local_1c0.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_1c0.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_118,-NAN,&local_1c0,
                                                                       SHORTEST_SINGLE);
                                                    pcVar3 = local_1c0.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar3 = 
                                                  "dc6.ToShortestSingle(-Single::NaN(), &builder)";
                                                  uVar5 = 0x1b3;
                                                  goto LAB_0082e313;
                                                  }
                                                  local_1c0.buffer_.start_[local_1c0.position_] =
                                                       '\0';
                                                  local_1c0.position_ = -1;
                                                  if (local_1c0.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082d96e;
                                                  iVar2 = strcmp("NaN",local_1c0.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    return;
                                                  }
                                                  pcVar4 = "\"NaN\"";
                                                  pcVar6 = "NaN";
                                                  uVar5 = 0x1b4;
                                                  }
                                                  else {
                                                    pcVar4 = "\"NaN\"";
                                                    pcVar6 = "NaN";
                                                    uVar5 = 0x1b0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"-Infinity\"";
                                                    pcVar6 = "-Infinity";
                                                    uVar5 = 0x1ac;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"Infinity\"";
                                                    pcVar6 = "Infinity";
                                                    uVar5 = 0x1a8;
                                                  }
                                                  goto LAB_0082e34b;
                                                  }
                                                  pcVar3 = 
                                                  "dc6.ToShortestSingle(Single::Infinity(), &builder)"
                                                  ;
                                                  uVar5 = 0x1a7;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dc4.ToShortestSingle(1111111111111111111111.0f, &builder)"
                                                  ;
                                                  uVar5 = 0x192;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dc4.ToShortestSingle(100000000000000000000.0f, &builder)"
                                                  ;
                                                  uVar5 = 0x18e;
                                                  }
                                                }
                                                else {
                                                  pcVar3 = 
                                                  "dc4.ToShortestSingle(111111111111111111111.0f, &builder)"
                                                  ;
                                                  uVar5 = 0x18a;
                                                }
                                              }
                                              else {
                                                pcVar3 = 
                                                "dc4.ToShortestSingle(0.0000001f, &builder)";
                                                uVar5 = 0x186;
                                              }
                                            }
                                            else {
                                              pcVar3 = "dc4.ToShortestSingle(0.000001f, &builder)";
                                              uVar5 = 0x182;
                                            }
                                          }
                                          else {
                                            pcVar3 = "dc3.ToShortestSingle(100000.0f, &builder)";
                                            uVar5 = 0x17a;
                                          }
                                        }
                                        else {
                                          pcVar3 = "dc3.ToShortestSingle(10000.0f, &builder)";
                                          uVar5 = 0x176;
                                        }
                                      }
                                      else {
                                        pcVar3 = "dc3.ToShortestSingle(1.0f, &builder)";
                                        uVar5 = 0x172;
                                      }
                                    }
                                    else {
                                      pcVar3 = "dc3.ToShortestSingle(0.1f, &builder)";
                                      uVar5 = 0x16e;
                                    }
                                  }
                                  else {
                                    pcVar3 = "dc2.ToShortestSingle(-0.0f, &builder)";
                                    uVar5 = 0x166;
                                  }
                                }
                                else {
                                  pcVar3 = "dc2.ToShortestSingle(10.0f, &builder)";
                                  uVar5 = 0x162;
                                }
                              }
                              else {
                                pcVar3 = "dc2.ToShortestSingle(1.0f, &builder)";
                                uVar5 = 0x15e;
                              }
                            }
                            else {
                              pcVar3 = "dc2.ToShortestSingle(0.01f, &builder)";
                              uVar5 = 0x15a;
                            }
                          }
                          else {
                            pcVar3 = "dc2.ToShortestSingle(0.1f, &builder)";
                            uVar5 = 0x156;
                          }
                        }
                        else {
                          pcVar3 = "dc.ToShortestSingle(-0.0f, &builder)";
                          uVar5 = 0x150;
                        }
                      }
                      else {
                        pcVar3 = "dc.ToShortestSingle(-0.0000001f, &builder)";
                        uVar5 = 0x14c;
                      }
                    }
                    else {
                      pcVar3 = "dc.ToShortestSingle(-0.000001f, &builder)";
                      uVar5 = 0x148;
                    }
                  }
                  else {
                    pcVar3 = "dc.ToShortestSingle(-0.00001f, &builder)";
                    uVar5 = 0x144;
                  }
                }
                else {
                  pcVar3 = "dc.ToShortestSingle(11111111111111111111111.0f, &builder)";
                  uVar5 = 0x140;
                }
              }
              else {
                pcVar3 = "dc.ToShortestSingle(1111111111111111111111.0f, &builder)";
                uVar5 = 0x13c;
              }
            }
            else {
              pcVar3 = "dc.ToShortestSingle(111111111111111111111.0f, &builder)";
              uVar5 = 0x138;
            }
          }
          else {
            pcVar3 = "dc.ToShortestSingle(1e20f, &builder)";
            uVar5 = 0x134;
          }
        }
        else {
          pcVar3 = "dc.ToShortestSingle(1e21f, &builder)";
          uVar5 = 0x130;
        }
      }
      else {
        pcVar3 = "dc.ToShortestSingle(12345e23f, &builder)";
        uVar5 = 300;
      }
    }
    else {
      pcVar3 = "dc.ToShortestSingle(12345.0f, &builder)";
      uVar5 = 0x128;
    }
  }
  else {
    pcVar3 = "dc.ToShortestSingle(0.0f, &builder)";
    uVar5 = 0x124;
  }
LAB_0082e313:
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar5,pcVar3);
  abort();
}

Assistant:

TEST(DoubleToShortestSingle) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  CHECK(dc.ToShortestSingle(0.0f, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(12345.0f, &builder));
  CHECK_EQ("12345", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(12345e23f, &builder));
  CHECK_EQ("1.2345e+27", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(1e21f, &builder));
  CHECK_EQ("1e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(1e20f, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(111111111111111111111.0f, &builder));
  CHECK_EQ("111111110000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(1111111111111111111111.0f, &builder));
  CHECK_EQ("1.11111114e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(11111111111111111111111.0f, &builder));
  CHECK_EQ("1.1111111e+22", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.00001f, &builder));
  CHECK_EQ("-0.00001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.000001f, &builder));
  CHECK_EQ("-0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.0000001f, &builder));
  CHECK_EQ("-1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortestSingle(-0.0f, &builder));
  CHECK_EQ("0", builder.Finalize());

  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, NULL, NULL, 'e', -1, 1, 0, 0);
  builder.Reset();
  CHECK(dc2.ToShortestSingle(0.1f, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(0.01f, &builder));
  CHECK_EQ("1e-2", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(1.0f, &builder));
  CHECK_EQ("1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(10.0f, &builder));
  CHECK_EQ("1e1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortestSingle(-0.0f, &builder));
  CHECK_EQ("-0", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc3(flags, NULL, NULL, 'E', -5, 5, 0, 0);

  builder.Reset();
  CHECK(dc3.ToShortestSingle(0.1f, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortestSingle(1.0f, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortestSingle(10000.0f, &builder));
  CHECK_EQ("10000.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortestSingle(100000.0f, &builder));
  CHECK_EQ("1E5", builder.Finalize());

  // Test the examples in the comments of ToShortestSingle.
  flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc4(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  builder.Reset();
  CHECK(dc4.ToShortestSingle(0.000001f, &builder));
  CHECK_EQ("0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(0.0000001f, &builder));
  CHECK_EQ("1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(111111111111111111111.0f, &builder));
  CHECK_EQ("111111110000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(100000000000000000000.0f, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortestSingle(1111111111111111111111.0f, &builder));
  CHECK_EQ("1.11111114e+21", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(Single::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(-Single::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(Single::NaN(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortestSingle(-Single::NaN(), &builder));

  DoubleToStringConverter dc6(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToShortestSingle(Single::Infinity(), &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortestSingle(-Single::Infinity(), &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortestSingle(Single::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortestSingle(-Single::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());
}